

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

string * __thiscall
cnn::PickElement::as_string
          (string *__return_storage_ptr__,PickElement *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  pointer pbVar1;
  ostream *poVar2;
  ostringstream s;
  char local_199;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"pick(",5);
  pbVar1 = (arg_names->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
  local_199 = ',';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_199,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_199 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_199,1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

string PickElement::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "pick(" << arg_names[0] << ',' << *pval << ')';
  return s.str();
}